

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::LightSource
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  float fVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  FileLoc *pFVar5;
  string *def;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  Float FVar6;
  allocator<char> local_195;
  Float local_194;
  string n;
  allocator<char> local_169;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ParameterDictionary dict;
  string extra;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  n._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&n);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  indent_abi_cxx11_(&n,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sLightSource \"%s\"\n",&n,name);
  std::__cxx11::string::~string((string *)&n);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  if (this->upgrade == true) {
    local_194 = 1.0;
    bVar3 = upgradeRGBToScale(&dict,"scale",&local_194);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&n,"scale",(allocator<char> *)&local_168);
      pFVar5 = ParameterDictionary::loc(&dict,&n);
      (this->super_SceneRepresentation).errorExit = true;
      Error(pFVar5,
            "In pbrt-v4, \"scale\" is a \"float\" parameter to light sources. Please modify your scene file manually."
           );
      goto LAB_0034cab2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n,"samples",(allocator<char> *)&local_168);
    ParameterDictionary::RemoveInt(&dict,&n);
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"mapname",(allocator<char> *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_195);
    ParameterDictionary::GetOneString(&n,&dict,&local_168,&local_148);
    sVar2 = n._M_string_length;
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    if (sVar2 != 0) {
      bVar3 = std::operator==(name,"infinite");
      if (bVar3) {
        bVar3 = upgradeRGBToScale(&dict,"L",&local_194);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&n,"L",(allocator<char> *)&local_168);
          pFVar5 = ParameterDictionary::loc(&dict,&n);
          (this->super_SceneRepresentation).errorExit = true;
          Error(pFVar5,
                "Non-constant \"L\" is no longer supported with \"mapname\" for the \"infinite\" light source. Please upgrade your scene file manually."
               );
          goto LAB_0034cab2;
        }
      }
      bVar3 = std::operator==(name,"projection");
      if (bVar3) {
        bVar3 = upgradeRGBToScale(&dict,"I",&local_194);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&n,"I",(allocator<char> *)&local_168);
          pFVar5 = ParameterDictionary::loc(&dict,&n);
          (this->super_SceneRepresentation).errorExit = true;
          Error(pFVar5,
                "\"I\" is no longer supported with \"mapname\" for the \"projection\" light source. Please upgrade your scene file manually."
               );
          goto LAB_0034cab2;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n,"I",(allocator<char> *)&local_168);
    FVar6 = ParameterDictionary::UpgradeBlackbody(&dict,&n);
    fVar1 = FVar6 * local_194;
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n,"L",(allocator<char> *)&local_168);
    FVar6 = ParameterDictionary::UpgradeBlackbody(&dict,&n);
    fVar1 = FVar6 * fVar1;
    local_194 = fVar1;
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"mapname",&local_195);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_169);
    def = &local_148;
    ParameterDictionary::GetOneString(&n,&dict,&local_168,def);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    if (n._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"",(allocator<char> *)&local_168);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"mapname",(allocator<char> *)&local_148);
      ParameterDictionary::RemoveString(&dict,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      indent_abi_cxx11_(&local_168,this,1);
      StringPrintf<std::__cxx11::string&>(&local_148,(pbrt *)0x27ec2d6,(char *)&n,def);
      std::operator+(&local_128,&local_168,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
    }
    std::__cxx11::string::~string((string *)&n);
    std::__cxx11::string::append((string *)&extra);
    std::__cxx11::string::~string((string *)&local_128);
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&n,"scale",(allocator<char> *)&local_168);
      FVar6 = ParameterDictionary::GetOneFloat(&dict,&n,1.0);
      local_194 = FVar6 * fVar1;
      std::__cxx11::string::~string((string *)&n);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&n,"scale",(allocator<char> *)&local_168);
      ParameterDictionary::RemoveFloat(&dict,&n);
      std::__cxx11::string::~string((string *)&n);
      indent_abi_cxx11_(&n,this,1);
      Printf<std::__cxx11::string,float&>("%s\"float scale\" [%f]\n",&n,&local_194);
      std::__cxx11::string::~string((string *)&n);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&n,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar4,(string *)&n);
LAB_0034cab2:
  std::__cxx11::string::~string((string *)&n);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::LightSource(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    Printf("%sLightSource \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        Float totalScale = 1;
        if (!upgradeRGBToScale(&dict, "scale", &totalScale)) {
            ErrorExitDeferred(dict.loc("scale"),
                              "In pbrt-v4, \"scale\" is a \"float\" parameter "
                              "to light sources. "
                              "Please modify your scene file manually.");
            return;
        }
        dict.RemoveInt("samples");

        if (dict.GetOneString("mapname", "").empty() == false) {
            if (name == "infinite" && !upgradeRGBToScale(&dict, "L", &totalScale)) {
                ErrorExitDeferred(
                    dict.loc("L"),
                    "Non-constant \"L\" is no longer supported with "
                    "\"mapname\" for "
                    "the \"infinite\" light source. Please upgrade your scene "
                    "file manually.");
                return;
            } else if (name == "projection" &&
                       !upgradeRGBToScale(&dict, "I", &totalScale)) {
                ErrorExitDeferred(
                    dict.loc("I"),
                    "\"I\" is no longer supported with \"mapname\" for "
                    "the \"projection\" light source. Please upgrade your scene "
                    "file manually.");
                return;
            }
        }

        totalScale *= dict.UpgradeBlackbody("I");
        totalScale *= dict.UpgradeBlackbody("L");

        // Do this after we've handled infinite "L" with a map, since
        // it removes the "mapname" parameter from the dictionary.
        extra += upgradeMapname(*this, &dict);

        if (totalScale != 1) {
            totalScale *= dict.GetOneFloat("scale", 1.f);
            dict.RemoveFloat("scale");
            Printf("%s\"float scale\" [%f]\n", indent(1), totalScale);
        }
    }

    std::cout << extra << dict.ToParameterList(catIndentCount);
}